

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.h
# Opt level: O0

void __thiscall leveldb::Version::Version(Version *this,VersionSet *vset)

{
  long lVar1;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDI;
  in_RDI[2] = in_RDI;
  *(undefined4 *)(in_RDI + 3) = 0;
  local_20 = (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
             (in_RDI + 4);
  do {
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::vector(local_20)
    ;
    local_20 = local_20 + 1;
  } while (local_20 !=
           (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
           (in_RDI + 0x19));
  in_RDI[0x19] = 0;
  *(undefined4 *)(in_RDI + 0x1a) = 0xffffffff;
  in_RDI[0x1b] = 0xbff0000000000000;
  *(undefined4 *)(in_RDI + 0x1c) = 0xffffffff;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit Version(VersionSet* vset)
      : vset_(vset),
        next_(this),
        prev_(this),
        refs_(0),
        file_to_compact_(nullptr),
        file_to_compact_level_(-1),
        compaction_score_(-1),
        compaction_level_(-1) {}